

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

void ddb_h2(Integer ndims,Integer *ardims,Integer npes,double threshold,Integer bias,Integer *blk,
           Integer *pedims)

{
  size_t sVar1;
  Integer *ardims_00;
  long lVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  size_t __nmemb;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  double dVar13;
  double dVar14;
  
  ardims_00 = (Integer *)calloc(ndims,8);
  if (ardims_00 != (Integer *)0x0) {
    lVar2 = 0;
    lVar9 = 0;
    if (0 < ndims) {
      lVar9 = ndims;
    }
    for (; lVar9 != lVar2; lVar2 = lVar2 + 1) {
      if (blk[lVar2] < 1) {
        blk[lVar2] = 1;
      }
    }
    for (lVar2 = 0; lVar9 != lVar2; lVar2 = lVar2 + 1) {
      ardims_00[lVar2] = (ardims[lVar2] + blk[lVar2] + -1) / blk[lVar2];
    }
    for (lVar2 = 0; lVar9 != lVar2; lVar2 = lVar2 + 1) {
      if (ardims_00[lVar2] < 1) {
        ardims_00[lVar2] = 1;
        blk[lVar2] = ardims[lVar2];
      }
    }
    __nmemb = 1;
    for (lVar2 = 2; lVar2 <= npes; lVar2 = lVar2 + 1) {
      __nmemb = __nmemb + (npes % lVar2 == 0);
    }
    __ptr = calloc(__nmemb,8);
    if (__ptr == (void *)0x0) {
      fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
      for (lVar2 = 0; lVar9 != lVar2; lVar2 = lVar2 + 1) {
        blk[lVar2] = 0;
      }
    }
    else {
      lVar4 = 0;
      lVar2 = 0;
      if (0 < npes) {
        lVar2 = npes;
      }
      for (lVar11 = 1; lVar11 - lVar2 != 1; lVar11 = lVar11 + 1) {
        if (npes % lVar11 == 0) {
          *(long *)((long)__ptr + lVar4 * 8) = lVar11;
          lVar4 = lVar4 + 1;
        }
      }
      if (1 < __nmemb) {
        sVar5 = 1;
        sVar8 = __nmemb;
        do {
          sVar1 = sVar5 + 1;
          __nmemb = sVar1;
          for (sVar12 = sVar1; (long)sVar12 < (long)sVar8; sVar12 = sVar12 + 1) {
            lVar2 = *(long *)((long)__ptr + sVar12 * 8);
            lVar4 = *(long *)((long)__ptr + sVar5 * 8);
            if (lVar2 % lVar4 == 0) {
              *(long *)((long)__ptr + __nmemb * 8) = lVar2 / lVar4;
              __nmemb = __nmemb + 1;
            }
          }
          sVar5 = sVar1;
          sVar8 = __nmemb;
        } while ((long)sVar1 < (long)__nmemb);
      }
      for (lVar2 = 0; lVar9 != lVar2; lVar2 = lVar2 + 1) {
        pedims[lVar2] = 1;
      }
      lVar2 = 0;
      if (0 < bias) {
        lVar2 = ndims + -1;
      }
      while (1 < (long)__nmemb) {
        __nmemb = __nmemb - 1;
        lVar4 = *(long *)((long)__ptr + __nmemb * 8);
        lVar11 = ardims_00[lVar2];
        dVar13 = 1.1;
        if (pedims[lVar2] * lVar4 <= lVar11) {
          dVar13 = (double)(lVar11 % (pedims[lVar2] * lVar4)) / (double)lVar11;
        }
        lVar11 = -1;
        lVar6 = lVar2;
        for (lVar10 = 1; lVar10 < ndims; lVar10 = lVar10 + 1) {
          lVar3 = lVar10;
          if (0 < bias) {
            lVar3 = lVar11;
          }
          lVar7 = (lVar3 + lVar2) % ndims;
          lVar3 = ardims_00[lVar7];
          dVar14 = 1.1;
          if (pedims[lVar7] * lVar4 <= lVar3) {
            dVar14 = (double)(lVar3 % (pedims[lVar7] * lVar4)) / (double)lVar3;
          }
          if (dVar13 <= dVar14) {
            dVar14 = dVar13;
            lVar7 = lVar6;
          }
          lVar6 = lVar7;
          dVar13 = dVar14;
          lVar11 = lVar11 + -1;
        }
        pedims[lVar6] = lVar4 * pedims[lVar6];
        if (bias == 0) {
          lVar2 = (lVar2 + 1) % ndims;
        }
      }
      free(__ptr);
      dVar13 = dd_ev(ndims,ardims_00,pedims);
      if (dVar13 < threshold) {
        ddb_ex(ndims,ardims_00,npes,threshold,blk,pedims);
      }
      dd_su(ndims,ardims,pedims,blk);
      for (lVar2 = 0; lVar9 != lVar2; lVar2 = lVar2 + 1) {
        lVar4 = pedims[lVar2];
        if (lVar4 < 1) {
          pnga_error("process dimension is zero: ddb_h2",0);
        }
        else {
          blk[lVar2] = (ardims_00[lVar2] + lVar4 + -1) / lVar4;
        }
      }
    }
    free(ardims_00);
    return;
  }
  lVar9 = 0;
  fprintf(_stderr,"%s: %s\n","ddb_h2","memory allocation failed");
  if (ndims < 1) {
    ndims = lVar9;
  }
  for (; ndims != lVar9; lVar9 = lVar9 + 1) {
    blk[lVar9] = 0;
  }
  return;
}

Assistant:

void ddb_h2(Integer ndims, Integer ardims[], Integer npes, double threshold, Integer bias,
            Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      Integer *tard;
      long * pdivs;
      long npdivs;
      long p0;
      double q, w;
      double ub;
      long istart, istep, ilook;

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h2",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;

      for(i=0;i<ndims;i++) tard[i] = (ardims[i]+ blk[i]-1)/blk[i]; /* JM */
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];
      }

      /*- Allocate storage to old all divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }
      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Find all prime divisors of npes (with repetitions) -*/
      if(npdivs>1) {
         k = 1;
         do {
            h = k+1;
            for(j=h;j<npdivs;j++)
            if(pdivs[j]%pdivs[k]==0)
               pdivs[h++] = pdivs[j]/pdivs[k];
            npdivs = h;
            k = k+1;
         } while(k<npdivs);
      }

      /*- Set istart and istep -*/
      istep = 1;
      istart = 0;
      if(bias>0) {
          istep = -1;
          istart = ndims-1;
      }
      /*- Set pedims -*/
      for(j=0;j<ndims;j++) pedims[j] = 1.0;
      for(k=npdivs-1;k>=1;k--){
         p0 = pdivs[k]; h = istart;
         q = (tard[istart]<p0*pedims[istart]) ? 1.1 :
             (tard[istart]%(p0*pedims[istart]))/(double) tard[istart];
         for(j=1;j<ndims;j++){
            ilook = (istart+istep*j)%ndims;
            w = (tard[ilook]<p0*pedims[ilook]) ? 1.1 :
                (tard[ilook]%(p0*pedims[ilook]))/(double) tard[ilook];
            if(w<q) { q = w; h = ilook; }
         }
         pedims[h] *= p0;
         if(bias==0) istart = (istart+1)%ndims;
      }
      free(pdivs);

      ub = dd_ev(ndims,tard,pedims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(ub<threshold) {
         ddb_ex(ndims, tard, npes, threshold, blk, pedims);
      }

      dd_su(ndims,ardims,pedims,blk);

      for(i=0;i<ndims;i++)
          if(pedims[i]>0){
             blk[i] = (tard[i]+pedims[i]-1)/pedims[i];
          } else {
             pnga_error("process dimension is zero: ddb_h2",0);
          }

      free(tard);
      return;
      }